

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

void Acb_NtkPushLogic2(Acb_Ntk_t *p,int nLutSize,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  uint uVar4;
  int iObj;
  ulong uVar5;
  
  Acb_NtkCreateFanout(p);
  uVar1 = (p->vObjType).nSize;
  uVar5 = 1;
  if (1 < (int)uVar1) {
    uVar5 = 1;
    do {
      if (uVar1 == uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar4 = (uint)(byte)(p->vObjType).pArray[uVar5];
      if ((4 < uVar4) || ((0x19U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_003a95e3;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar5 = (ulong)uVar1;
  }
LAB_003a95e3:
  iObj = (int)uVar5;
  if (iObj < (p->vObjFans).nSize) {
    uVar5 = uVar5 & 0xffffffff;
    iVar2 = (p->vObjFans).pArray[uVar5];
    if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    if ((p->vFanouts).nSize <= iObj) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar3 = (p->vFanouts).pArray;
    if (0 < pVVar3[uVar5].nSize) {
      Acb_ObjPushToFanout(p,iObj,(p->vFanSto).pArray[iVar2] + -1,*pVVar3[uVar5].pArray);
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_NtkPushLogic2( Acb_Ntk_t * p, int nLutSize, int fVerbose )
{
    int iObj;
    Acb_NtkCreateFanout( p );  // fanout data structure
    Acb_NtkForEachObj( p, iObj )
        if ( !Acb_ObjIsCio(p, iObj) )
            break;
    Acb_ObjPushToFanout( p, iObj, Acb_ObjFaninNum(p, iObj)-1, Acb_ObjFanout(p, iObj, 0) );
//    Acb_ObjPushToFanin( p, Acb_ObjFanout(p, iObj, 0), Acb_ObjFaninNum(p, iObj)-1, iObj );
}